

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_dm.cxx
# Opt level: O1

xr_surface * __thiscall
xray_re::xr_level_dm::create_surface(xr_level_dm *this,xr_raw_surface *raw_surface)

{
  xr_surface *this_00;
  
  this_00 = (xr_surface *)operator_new(0xd0);
  xr_surface::xr_surface(this_00,false);
  std::__cxx11::string::_M_assign((string *)&this_00->m_texture);
  std::__cxx11::string::_M_assign((string *)&this_00->m_eshader);
  this_00->m_flags = 1;
  return this_00;
}

Assistant:

xr_surface* xr_level_dm::create_surface(const xr_raw_surface& raw_surface) const
{
	xr_surface* surface = new xr_surface;
	surface->texture() = texture();
	surface->eshader() = shader();
	surface->set_two_sided();
	return surface;
}